

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int patternCompare(u8 *zPattern,u8 *zString,compareInfo *pInfo,u32 matchOther)

{
  u32 uVar1;
  int iVar2;
  u32 uVar3;
  size_t sVar4;
  uint in_ECX;
  byte *pbVar5;
  byte *in_RDX;
  byte *in_RSI;
  byte *in_RDI;
  bool bVar6;
  bool bVar7;
  int invert;
  int seen;
  u32 prior_c;
  int bMatch_2;
  int bMatch_1;
  char zStop [3];
  int bMatch;
  u8 *zEscaped;
  u8 noCase;
  u32 matchAll;
  u32 matchOne;
  u32 c2;
  u32 c;
  uint local_74;
  u32 local_6c;
  uint local_64;
  uint local_60;
  uint local_54;
  byte local_47;
  uchar local_46;
  undefined1 local_45;
  undefined4 local_44;
  byte *local_40;
  byte local_35;
  uint local_34;
  uint local_30;
  uint in_stack_ffffffffffffffd4;
  byte *local_10 [2];
  
  local_30 = (uint)in_RDX[1];
  local_34 = (uint)*in_RDX;
  local_35 = in_RDX[3];
  local_40 = (byte *)0x0;
  local_10[0] = in_RDI;
  do {
    while( true ) {
      if (*local_10[0] < 0x80) {
        local_60 = (uint)*local_10[0];
        local_10[0] = local_10[0] + 1;
      }
      else {
        local_60 = sqlite3Utf8Read(local_10);
      }
      if (local_60 == 0) {
        return (uint)(*in_RSI != 0);
      }
      if (local_60 == local_34) {
        while( true ) {
          if (*local_10[0] < 0x80) {
            local_64 = (uint)*local_10[0];
            local_10[0] = local_10[0] + 1;
          }
          else {
            local_64 = sqlite3Utf8Read(local_10);
          }
          if (local_64 != local_34 && local_64 != local_30) break;
          if ((local_64 == local_30) &&
             (uVar1 = sqlite3Utf8Read((uchar **)&stack0xffffffffffffffe8), uVar1 == 0)) {
            return 2;
          }
        }
        if (local_64 == 0) {
          return 0;
        }
        if (local_64 == in_ECX) {
          if (in_RDX[2] != 0) {
            while( true ) {
              if (*in_RSI == 0) {
                return 2;
              }
              iVar2 = patternCompare(in_RSI,in_RDX,(compareInfo *)CONCAT44(in_ECX,local_64),
                                     in_stack_ffffffffffffffd4);
              if (iVar2 != 1) break;
              pbVar5 = in_RSI + 1;
              if (0xbf < *in_RSI) {
                for (; (*pbVar5 & 0xc0) == 0x80; pbVar5 = pbVar5 + 1) {
                }
              }
              local_44 = 1;
              in_RSI = pbVar5;
            }
            return iVar2;
          }
          local_64 = sqlite3Utf8Read(local_10);
          if (local_64 == 0) {
            return 2;
          }
        }
        if (local_64 < 0x81) {
          local_47 = (byte)local_64;
          if (local_35 == 0) {
            local_46 = '\0';
          }
          else {
            local_47 = local_47 & (""[local_64 & 0xff] & 0x20 ^ 0xff);
            local_46 = ""[local_64 & 0xff];
            local_45 = 0;
          }
          while( true ) {
            sVar4 = strcspn((char *)in_RSI,(char *)&local_47);
            if (in_RSI[sVar4] == 0) break;
            in_RSI = in_RSI + sVar4 + 1;
            iVar2 = patternCompare(in_RSI,in_RDX,(compareInfo *)CONCAT44(in_ECX,local_64),
                                   in_stack_ffffffffffffffd4);
            if (iVar2 != 1) {
              return iVar2;
            }
          }
        }
        else {
          while( true ) {
            if (*in_RSI < 0x80) {
              local_6c = (u32)*in_RSI;
              in_RSI = in_RSI + 1;
            }
            else {
              local_6c = sqlite3Utf8Read((uchar **)&stack0xffffffffffffffe8);
            }
            if (local_6c == 0) break;
            if ((local_6c == local_64) &&
               (iVar2 = patternCompare(in_RSI,in_RDX,(compareInfo *)CONCAT44(in_ECX,local_64),
                                       local_6c), iVar2 != 1)) {
              return iVar2;
            }
          }
        }
        return 2;
      }
      if (local_60 == in_ECX) break;
LAB_00139a84:
      if (*in_RSI < 0x80) {
        local_74 = (uint)*in_RSI;
        in_RSI = in_RSI + 1;
      }
      else {
        local_74 = sqlite3Utf8Read((uchar **)&stack0xffffffffffffffe8);
      }
      in_stack_ffffffffffffffd4 = local_74;
      if (((local_60 != local_74) &&
          ((((local_35 == 0 || (""[local_60 & 0xff] != ""[local_74 & 0xff])) || (0x7f < local_60))
           || (0x7f < local_74)))) &&
         (((local_60 != local_30 || (local_10[0] == local_40)) || (local_74 == 0)))) {
        return 1;
      }
    }
    if (in_RDX[2] == 0) {
      local_60 = sqlite3Utf8Read(local_10);
      if (local_60 == 0) {
        return 1;
      }
      local_40 = local_10[0];
      goto LAB_00139a84;
    }
    local_54 = 0;
    bVar7 = false;
    uVar1 = sqlite3Utf8Read((uchar **)&stack0xffffffffffffffe8);
    if (uVar1 == 0) {
      return 1;
    }
    in_stack_ffffffffffffffd4 = sqlite3Utf8Read(local_10);
    bVar6 = in_stack_ffffffffffffffd4 == 0x5e;
    if (bVar6) {
      in_stack_ffffffffffffffd4 = sqlite3Utf8Read(local_10);
    }
    if (in_stack_ffffffffffffffd4 == 0x5d) {
      bVar7 = uVar1 == 0x5d;
      in_stack_ffffffffffffffd4 = sqlite3Utf8Read(local_10);
    }
    while (in_stack_ffffffffffffffd4 != 0 && in_stack_ffffffffffffffd4 != 0x5d) {
      if ((((in_stack_ffffffffffffffd4 == 0x2d) && (*local_10[0] != 0x5d)) && (*local_10[0] != 0))
         && (local_54 != 0)) {
        uVar3 = sqlite3Utf8Read(local_10);
        if ((local_54 <= uVar1) && (uVar1 <= uVar3)) {
          bVar7 = true;
        }
        local_54 = 0;
      }
      else {
        local_54 = in_stack_ffffffffffffffd4;
        if (uVar1 == in_stack_ffffffffffffffd4) {
          bVar7 = true;
        }
      }
      in_stack_ffffffffffffffd4 = sqlite3Utf8Read(local_10);
    }
    if ((in_stack_ffffffffffffffd4 == 0) || (bVar7 == bVar6)) {
      return 1;
    }
  } while( true );
}

Assistant:

static int patternCompare(
  const u8 *zPattern,              /* The glob pattern */
  const u8 *zString,               /* The string to compare against the glob */
  const struct compareInfo *pInfo, /* Information about how to do the compare */
  u32 matchOther                   /* The escape char (LIKE) or '[' (GLOB) */
){
  u32 c, c2;                       /* Next pattern and input string chars */
  u32 matchOne = pInfo->matchOne;  /* "?" or "_" */
  u32 matchAll = pInfo->matchAll;  /* "*" or "%" */
  u8 noCase = pInfo->noCase;       /* True if uppercase==lowercase */
  const u8 *zEscaped = 0;          /* One past the last escaped input char */
  
  while( (c = Utf8Read(zPattern))!=0 ){
    if( c==matchAll ){  /* Match "*" */
      /* Skip over multiple "*" characters in the pattern.  If there
      ** are also "?" characters, skip those as well, but consume a
      ** single character of the input string for each "?" skipped */
      while( (c=Utf8Read(zPattern)) == matchAll || c == matchOne ){
        if( c==matchOne && sqlite3Utf8Read(&zString)==0 ){
          return SQLITE_NOWILDCARDMATCH;
        }
      }
      if( c==0 ){
        return SQLITE_MATCH;   /* "*" at the end of the pattern matches */
      }else if( c==matchOther ){
        if( pInfo->matchSet==0 ){
          c = sqlite3Utf8Read(&zPattern);
          if( c==0 ) return SQLITE_NOWILDCARDMATCH;
        }else{
          /* "[...]" immediately follows the "*".  We have to do a slow
          ** recursive search in this case, but it is an unusual case. */
          assert( matchOther<0x80 );  /* '[' is a single-byte character */
          while( *zString ){
            int bMatch = patternCompare(&zPattern[-1],zString,pInfo,matchOther);
            if( bMatch!=SQLITE_NOMATCH ) return bMatch;
            SQLITE_SKIP_UTF8(zString);
          }
          return SQLITE_NOWILDCARDMATCH;
        }
      }

      /* At this point variable c contains the first character of the
      ** pattern string past the "*".  Search in the input string for the
      ** first matching character and recursively continue the match from
      ** that point.
      **
      ** For a case-insensitive search, set variable cx to be the same as
      ** c but in the other case and search the input string for either
      ** c or cx.
      */
      if( c<=0x80 ){
        char zStop[3];
        int bMatch;
        if( noCase ){
          zStop[0] = sqlite3Toupper(c);
          zStop[1] = sqlite3Tolower(c);
          zStop[2] = 0;
        }else{
          zStop[0] = c;
          zStop[1] = 0;
        }
        while(1){
          zString += strcspn((const char*)zString, zStop);
          if( zString[0]==0 ) break;
          zString++;
          bMatch = patternCompare(zPattern,zString,pInfo,matchOther);
          if( bMatch!=SQLITE_NOMATCH ) return bMatch;
        }
      }else{
        int bMatch;
        while( (c2 = Utf8Read(zString))!=0 ){
          if( c2!=c ) continue;
          bMatch = patternCompare(zPattern,zString,pInfo,matchOther);
          if( bMatch!=SQLITE_NOMATCH ) return bMatch;
        }
      }
      return SQLITE_NOWILDCARDMATCH;
    }
    if( c==matchOther ){
      if( pInfo->matchSet==0 ){
        c = sqlite3Utf8Read(&zPattern);
        if( c==0 ) return SQLITE_NOMATCH;
        zEscaped = zPattern;
      }else{
        u32 prior_c = 0;
        int seen = 0;
        int invert = 0;
        c = sqlite3Utf8Read(&zString);
        if( c==0 ) return SQLITE_NOMATCH;
        c2 = sqlite3Utf8Read(&zPattern);
        if( c2=='^' ){
          invert = 1;
          c2 = sqlite3Utf8Read(&zPattern);
        }
        if( c2==']' ){
          if( c==']' ) seen = 1;
          c2 = sqlite3Utf8Read(&zPattern);
        }
        while( c2 && c2!=']' ){
          if( c2=='-' && zPattern[0]!=']' && zPattern[0]!=0 && prior_c>0 ){
            c2 = sqlite3Utf8Read(&zPattern);
            if( c>=prior_c && c<=c2 ) seen = 1;
            prior_c = 0;
          }else{
            if( c==c2 ){
              seen = 1;
            }
            prior_c = c2;
          }
          c2 = sqlite3Utf8Read(&zPattern);
        }
        if( c2==0 || (seen ^ invert)==0 ){
          return SQLITE_NOMATCH;
        }
        continue;
      }
    }
    c2 = Utf8Read(zString);
    if( c==c2 ) continue;
    if( noCase  && sqlite3Tolower(c)==sqlite3Tolower(c2) && c<0x80 && c2<0x80 ){
      continue;
    }
    if( c==matchOne && zPattern!=zEscaped && c2!=0 ) continue;
    return SQLITE_NOMATCH;
  }
  return *zString==0 ? SQLITE_MATCH : SQLITE_NOMATCH;
}